

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O3

int wally_psbt_remove_input(wally_psbt *psbt,uint32_t index)

{
  wally_tx *tx;
  int iVar1;
  ulong uVar2;
  ulong index_00;
  
  iVar1 = -2;
  if (((psbt != (wally_psbt *)0x0) && (tx = psbt->tx, tx != (wally_tx *)0x0)) &&
     (tx->num_inputs == psbt->num_inputs)) {
    index_00 = (ulong)index;
    uVar2 = index_00;
    iVar1 = wally_tx_remove_input(tx,index_00);
    if (iVar1 == 0) {
      psbt_input_free(psbt->inputs + index_00,SUB81(uVar2,0));
      memmove(psbt->inputs + index_00,psbt->inputs + index_00 + 1,
              (~index_00 + psbt->num_inputs) * 0x110);
      psbt->num_inputs = psbt->num_inputs - 1;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int wally_psbt_remove_input(struct wally_psbt *psbt, uint32_t index)
{
    int ret;

    if (!psbt || !psbt->tx || psbt->tx->num_inputs != psbt->num_inputs)
        ret = WALLY_EINVAL;
    else
        ret = wally_tx_remove_input(psbt->tx, index);
    if (ret == WALLY_OK) {
        psbt_input_free(&psbt->inputs[index], false);
        memmove(psbt->inputs + index, psbt->inputs + index + 1,
                (psbt->num_inputs - index - 1) * sizeof(struct wally_psbt_input));
        psbt->num_inputs -= 1;
    }
    return ret;
}